

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O0

char * kstrtok(char *str,char *sep,ks_tokaux_t *aux)

{
  char *local_38;
  char *start;
  char *p;
  ks_tokaux_t *aux_local;
  char *sep_local;
  char *str_local;
  
  if (sep != (char *)0x0) {
    if ((str == (char *)0x0) && ((aux->tab[0] & 1) != 0)) {
      return (char *)0x0;
    }
    aux->finished = 0;
    if (sep[1] == '\0') {
      aux->sep = (int)*sep;
    }
    else {
      aux->sep = -1;
      aux->tab[3] = 0;
      aux->tab[2] = 0;
      aux->tab[1] = 0;
      aux->tab[0] = 0;
      for (start = sep; *start != '\0'; start = start + 1) {
        aux->tab[(int)*start >> 6] = 1L << (*start & 0x3fU) | aux->tab[(int)*start >> 6];
      }
    }
  }
  if (aux->finished == 0) {
    if (str != (char *)0x0) {
      aux->p = str + -1;
      aux->finished = 0;
    }
    if (aux->sep < 0) {
      local_38 = aux->p + 1;
      start = local_38;
      while ((*start != '\0' && ((aux->tab[(int)*start >> 6] >> (*start & 0x3fU) & 1) == 0))) {
        start = start + 1;
      }
    }
    else {
      local_38 = aux->p + 1;
      for (start = local_38; (*start != '\0' && ((int)*start != aux->sep)); start = start + 1) {
      }
    }
    aux->p = start;
    if (*start == '\0') {
      aux->finished = 1;
    }
    str_local = local_38;
  }
  else {
    str_local = (char *)0x0;
  }
  return str_local;
}

Assistant:

char *kstrtok(const char *str, const char *sep, ks_tokaux_t *aux)
{
	const char *p, *start;
	if (sep) { // set up the table
		if (str == 0 && (aux->tab[0]&1)) return 0; // no need to set up if we have finished
		aux->finished = 0;
		if (sep[1]) {
			aux->sep = -1;
			aux->tab[0] = aux->tab[1] = aux->tab[2] = aux->tab[3] = 0;
			for (p = sep; *p; ++p) aux->tab[*p>>6] |= 1ull<<(*p&0x3f);
		} else aux->sep = sep[0];
	}
	if (aux->finished) return 0;
	else if (str) aux->p = str - 1, aux->finished = 0;
	if (aux->sep < 0) {
		for (p = start = aux->p + 1; *p; ++p)
			if (aux->tab[*p>>6]>>(*p&0x3f)&1) break;
	} else {
		for (p = start = aux->p + 1; *p; ++p)
			if (*p == aux->sep) break;
	}
	aux->p = p; // end of token
	if (*p == 0) aux->finished = 1; // no more tokens
	return (char*)start;
}